

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O0

int main(void)

{
  offset_in_User_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  code *local_68;
  undefined8 local_60;
  User *local_58;
  __normal_iterator<const_User_*,_std::vector<User,_std::allocator<User>_>_> local_50;
  offset_in_User_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  offset_in_User_to_bool local_40;
  User *local_38;
  __normal_iterator<const_User_*,_std::vector<User,_std::allocator<User>_>_> local_30;
  identity local_22;
  anon_class_1_0_00000001 local_21;
  User *local_20;
  __normal_iterator<const_User_*,_std::vector<User,_std::allocator<User>_>_> local_18;
  undefined4 local_c;
  
  local_c = 0;
  std::operator<<((ostream *)&std::cout,"Users:\n");
  local_18._M_current = (User *)std::vector<User,_std::allocator<User>_>::begin(&users);
  local_20 = (User *)std::vector<User,_std::allocator<User>_>::end(&users);
  print_if<__gnu_cxx::__normal_iterator<User_const*,std::vector<User,std::allocator<User>>>,__gnu_cxx::__normal_iterator<User_const*,std::vector<User,std::allocator<User>>>,main::__0,identity>
            (local_18,(__normal_iterator<const_User_*,_std::vector<User,_std::allocator<User>_>_>)
                      local_20,&local_21,&local_22);
  std::operator<<((ostream *)&std::cout,'\n');
  std::operator<<((ostream *)&std::cout,"Superusers:\n");
  local_30._M_current = (User *)std::vector<User,_std::allocator<User>_>::begin(&users);
  local_38 = (User *)std::vector<User,_std::allocator<User>_>::end(&users);
  local_40 = 0x20;
  local_48 = 0;
  print_if<__gnu_cxx::__normal_iterator<User_const*,std::vector<User,std::allocator<User>>>,__gnu_cxx::__normal_iterator<User_const*,std::vector<User,std::allocator<User>>>,bool_User::*,std::__cxx11::string_User::*>
            (local_30,(__normal_iterator<const_User_*,_std::vector<User,_std::allocator<User>_>_>)
                      local_38,&local_40,&local_48);
  std::operator<<((ostream *)&std::cout,'\n');
  std::operator<<((ostream *)&std::cout,"Regular users:\n");
  local_50._M_current = (User *)std::vector<User,_std::allocator<User>_>::begin(&users);
  local_58 = (User *)std::vector<User,_std::allocator<User>_>::end(&users);
  local_68 = User::is_regular_user;
  local_60 = 0;
  local_70 = 0;
  print_if<__gnu_cxx::__normal_iterator<User_const*,std::vector<User,std::allocator<User>>>,__gnu_cxx::__normal_iterator<User_const*,std::vector<User,std::allocator<User>>>,bool(User::*)()noexcept_const,std::__cxx11::string_User::*>
            (local_50,(__normal_iterator<const_User_*,_std::vector<User,_std::allocator<User>_>_>)
                      local_58,(offset_in_User_to_subr *)&local_68,&local_70);
  std::operator<<((ostream *)&std::cout,'\n');
  return 0;
}

Assistant:

int main()
{
    /// print all users
    ///
    /// `eggs::invoke(<lambda>, user)` is equivalent to `<lambda>(user)`.
    std::cout << "Users:\n";
    print_if(users.begin(), users.end(), [](User const&) { return true; });
    std::cout << '\n';

    /// print the names of superusers
    ///
    /// `eggs::invoke(&User::is_superuser, user)` is equivalent to
    /// `user.is_superuser` or `user->is_superuser`.
    std::cout << "Superusers:\n";
    print_if(users.begin(), users.end(), &User::is_superuser, &User::name);
    std::cout << '\n';

    /// print the names of regular users
    ///
    /// `eggs::invoke(&User::is_regular_user, user)` is equivalent to
    /// `user.is_regular_user()` or `user->is_regular_user()`.
    std::cout << "Regular users:\n";
    print_if(users.begin(), users.end(), &User::is_regular_user, &User::name);
    std::cout << '\n';

    return 0;
}